

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dqt(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_source_mgr *pjVar2;
  jpeg_error_mgr *pjVar3;
  ushort uVar4;
  boolean bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  JQUANT_TBL *pJVar9;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  int *natural_order;
  JQUANT_TBL *quant_ptr;
  uint tmp;
  int prec;
  int n;
  INT32 i;
  INT32 count;
  INT32 length;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar2->next_input_byte;
  _mp = (int *)pjVar2->bytes_in_buffer;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    _mp = (int *)pjVar2->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    _mp = (int *)pjVar2->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  count = (ulong)*(byte *)bytes_in_buffer + (ulong)bVar1 * 0x100 + -2;
  bytes_in_buffer = bytes_in_buffer + 1;
  do {
    if (count < 1) {
      if (count != 0) {
        cinfo->err->msg_code = 0xc;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      pjVar2->next_input_byte = (JOCTET *)bytes_in_buffer;
      pjVar2->bytes_in_buffer = (size_t)_mp;
      return 1;
    }
    lVar8 = count + -1;
    if (_mp == (int *)0x0) {
      bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
      if (bVar5 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar2->next_input_byte;
      _mp = (int *)pjVar2->bytes_in_buffer;
    }
    iVar6 = (int)(uint)*(byte *)bytes_in_buffer >> 4;
    uVar7 = *(byte *)bytes_in_buffer & 0xf;
    cinfo->err->msg_code = 0x53;
    (cinfo->err->msg_parm).i[0] = uVar7;
    (cinfo->err->msg_parm).i[1] = iVar6;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    if (3 < uVar7) {
      cinfo->err->msg_code = 0x20;
      (cinfo->err->msg_parm).i[0] = uVar7;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->quant_tbl_ptrs[(int)uVar7] == (JQUANT_TBL *)0x0) {
      pJVar9 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
      cinfo->quant_tbl_ptrs[(int)uVar7] = pJVar9;
    }
    pJVar9 = cinfo->quant_tbl_ptrs[(int)uVar7];
    if (iVar6 == 0) {
      if (lVar8 < 0x40) {
        for (_prec = 0; i = lVar8, _prec < 0x40; _prec = _prec + 1) {
          pJVar9->quantval[_prec] = 1;
        }
      }
      else {
        i = 0x40;
      }
    }
    else if (lVar8 < 0x80) {
      for (_prec = 0; _prec < 0x40; _prec = _prec + 1) {
        pJVar9->quantval[_prec] = 1;
      }
      i = lVar8 >> 1;
    }
    else {
      i = 0x40;
    }
    switch(i) {
    case 4:
      datasrc = (jpeg_source_mgr *)jpeg_natural_order2;
      break;
    default:
      datasrc = (jpeg_source_mgr *)jpeg_natural_order;
      break;
    case 9:
      datasrc = (jpeg_source_mgr *)jpeg_natural_order3;
      break;
    case 0x10:
      datasrc = (jpeg_source_mgr *)jpeg_natural_order4;
      break;
    case 0x19:
      datasrc = (jpeg_source_mgr *)jpeg_natural_order5;
      break;
    case 0x24:
      datasrc = (jpeg_source_mgr *)jpeg_natural_order6;
      break;
    case 0x31:
      datasrc = (jpeg_source_mgr *)jpeg_natural_order7;
    }
    _prec = 0;
    while( true ) {
      bytes_in_buffer = bytes_in_buffer + 1;
      _mp = (int *)((long)_mp + -1);
      if (i <= _prec) break;
      if (iVar6 == 0) {
        if (_mp == (int *)0x0) {
          bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
          if (bVar5 == 0) {
            return 0;
          }
          bytes_in_buffer = (size_t)pjVar2->next_input_byte;
          _mp = (int *)pjVar2->bytes_in_buffer;
        }
        uVar4 = (ushort)*(byte *)bytes_in_buffer;
      }
      else {
        if (_mp == (int *)0x0) {
          bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
          if (bVar5 == 0) {
            return 0;
          }
          bytes_in_buffer = (size_t)pjVar2->next_input_byte;
          _mp = (int *)pjVar2->bytes_in_buffer;
        }
        _mp = (int *)((long)_mp + -1);
        bVar1 = *(byte *)bytes_in_buffer;
        bytes_in_buffer = bytes_in_buffer + 1;
        if (_mp == (int *)0x0) {
          bVar5 = (*pjVar2->fill_input_buffer)(cinfo);
          if (bVar5 == 0) {
            return 0;
          }
          bytes_in_buffer = (size_t)pjVar2->next_input_byte;
          _mp = (int *)pjVar2->bytes_in_buffer;
        }
        uVar4 = (ushort)*(byte *)bytes_in_buffer + (ushort)bVar1 * 0x100;
      }
      pJVar9->quantval[*(int *)((long)&datasrc->next_input_byte + _prec * 4)] = uVar4;
      _prec = _prec + 1;
    }
    if (1 < cinfo->err->trace_level) {
      for (_prec = 0; _prec < 0x40; _prec = _prec + 8) {
        pjVar3 = cinfo->err;
        *(uint *)&pjVar3->msg_parm = (uint)pJVar9->quantval[_prec];
        *(uint *)((long)&pjVar3->msg_parm + 4) = (uint)pJVar9->quantval[_prec + 1];
        *(uint *)((long)&pjVar3->msg_parm + 8) = (uint)pJVar9->quantval[_prec + 2];
        *(uint *)((long)&pjVar3->msg_parm + 0xc) = (uint)pJVar9->quantval[_prec + 3];
        *(uint *)((long)&pjVar3->msg_parm + 0x10) = (uint)pJVar9->quantval[_prec + 4];
        *(uint *)((long)&pjVar3->msg_parm + 0x14) = (uint)pJVar9->quantval[_prec + 5];
        *(uint *)((long)&pjVar3->msg_parm + 0x18) = (uint)pJVar9->quantval[_prec + 6];
        *(uint *)((long)&pjVar3->msg_parm + 0x1c) = (uint)pJVar9->quantval[_prec + 7];
        cinfo->err->msg_code = 0x5f;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,2);
      }
    }
    count = lVar8 - i;
    if (iVar6 != 0) {
      count = count - i;
    }
  } while( true );
}

Assistant:

LOCAL(boolean)
get_dqt (j_decompress_ptr cinfo)
/* Process a DQT marker */
{
  INT32 length, count, i;
  int n, prec;
  unsigned int tmp;
  JQUANT_TBL *quant_ptr;
  const int *natural_order;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  while (length > 0) {
    length--;
    INPUT_BYTE(cinfo, n, return FALSE);
    prec = n >> 4;
    n &= 0x0F;

    TRACEMS2(cinfo, 1, JTRC_DQT, n, prec);

    if (n >= NUM_QUANT_TBLS)
      ERREXIT1(cinfo, JERR_DQT_INDEX, n);
      
    if (cinfo->quant_tbl_ptrs[n] == NULL)
      cinfo->quant_tbl_ptrs[n] = jpeg_alloc_quant_table((j_common_ptr) cinfo);
    quant_ptr = cinfo->quant_tbl_ptrs[n];

    if (prec) {
      if (length < DCTSIZE2 * 2) {
	/* Initialize full table for safety. */
	for (i = 0; i < DCTSIZE2; i++) {
	  quant_ptr->quantval[i] = 1;
	}
	count = length >> 1;
      } else
	count = DCTSIZE2;
    } else {
      if (length < DCTSIZE2) {
	/* Initialize full table for safety. */
	for (i = 0; i < DCTSIZE2; i++) {
	  quant_ptr->quantval[i] = 1;
	}
	count = length;
      } else
	count = DCTSIZE2;
    }

    switch (count) {
    case (2*2): natural_order = jpeg_natural_order2; break;
    case (3*3): natural_order = jpeg_natural_order3; break;
    case (4*4): natural_order = jpeg_natural_order4; break;
    case (5*5): natural_order = jpeg_natural_order5; break;
    case (6*6): natural_order = jpeg_natural_order6; break;
    case (7*7): natural_order = jpeg_natural_order7; break;
    default:    natural_order = jpeg_natural_order;  break;
    }

    for (i = 0; i < count; i++) {
      if (prec)
	INPUT_2BYTES(cinfo, tmp, return FALSE);
      else
	INPUT_BYTE(cinfo, tmp, return FALSE);
      /* We convert the zigzag-order table to natural array order. */
      quant_ptr->quantval[natural_order[i]] = (UINT16) tmp;
    }

    if (cinfo->err->trace_level >= 2) {
      for (i = 0; i < DCTSIZE2; i += 8) {
	TRACEMS8(cinfo, 2, JTRC_QUANTVALS,
		 quant_ptr->quantval[i],   quant_ptr->quantval[i+1],
		 quant_ptr->quantval[i+2], quant_ptr->quantval[i+3],
		 quant_ptr->quantval[i+4], quant_ptr->quantval[i+5],
		 quant_ptr->quantval[i+6], quant_ptr->quantval[i+7]);
      }
    }

    length -= count;
    if (prec) length -= count;
  }

  if (length != 0)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_SYNC(cinfo);
  return TRUE;
}